

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O1

ssize_t __thiscall Buffers::read(Buffers *this,int __fd,void *__buf,size_t __nbytes)

{
  Buffers *pBVar1;
  iterator __position;
  bool bVar2;
  void *pvVar3;
  ssize_t sVar4;
  undefined4 in_register_00000034;
  void *pvVar5;
  void *__n;
  
  if (__buf == (void *)0x0) {
    sVar4 = 0;
  }
  else {
    sVar4 = 0;
    do {
      pBVar1 = (Buffers *)
               (this->mBuffers).super_list<Buffer,_std::allocator<Buffer>_>.
               super__List_base<Buffer,_std::allocator<Buffer>_>._M_impl._M_node.
               super__List_node_base._M_next;
      if (pBVar1 == this) {
        return sVar4;
      }
      __n = (void *)(pBVar1->mBufferOffset - this->mBufferOffset);
      pvVar3 = (void *)(CONCAT44(in_register_00000034,__fd) + sVar4);
      pvVar5 = (void *)(this->mBufferOffset +
                       (pBVar1->mBuffers).super_list<Buffer,_std::allocator<Buffer>_>.
                       super__List_base<Buffer,_std::allocator<Buffer>_>._M_impl._M_node._M_size);
      if (__buf < __n || (void *)((long)__buf - (long)__n) == (void *)0x0) {
        memcpy(pvVar3,pvVar5,(size_t)__buf);
        pvVar3 = __buf;
        pvVar5 = __buf;
        if (__buf == __n) {
          this->mBufferOffset = 0;
          std::__cxx11::list<Buffer,_std::allocator<Buffer>_>::_M_erase
                    ((list<Buffer,_std::allocator<Buffer>_> *)this,
                     (this->mBuffers).super_list<Buffer,_std::allocator<Buffer>_>.
                     super__List_base<Buffer,_std::allocator<Buffer>_>._M_impl._M_node.
                     super__List_node_base._M_next);
        }
        else {
          this->mBufferOffset = this->mBufferOffset + (long)__buf;
        }
      }
      else {
        memcpy(pvVar3,pvVar5,(size_t)__n);
        this->mBufferOffset = 0;
        __position._M_node =
             (this->mBuffers).super_list<Buffer,_std::allocator<Buffer>_>.
             super__List_base<Buffer,_std::allocator<Buffer>_>._M_impl._M_node.super__List_node_base
             ._M_next;
        if ((Buffers *)__position._M_node == this) {
          __assert_fail("!mBuffers.isEmpty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Buffer.h"
                        ,0x8f,"size_t Buffers::read(void *, size_t)");
        }
        std::__cxx11::list<Buffer,_std::allocator<Buffer>_>::_M_erase
                  ((list<Buffer,_std::allocator<Buffer>_> *)this,__position);
        pvVar3 = __n;
        pvVar5 = (void *)((long)__buf - (long)__n);
      }
      sVar4 = sVar4 + (long)pvVar3;
      bVar2 = __n < __buf;
      __buf = pvVar5;
    } while (bVar2);
  }
  return sVar4;
}

Assistant:

size_t read(void *outPtr, size_t size)
    {
        if (!size)
            return 0;

        unsigned char *out = static_cast<unsigned char *>(outPtr);
        size_t read = 0, remaining = size;
        while (!mBuffers.empty()) {
            const auto &buf = mBuffers.front();
            const size_t bufferSize = buf.size() - mBufferOffset;

            if (remaining <= bufferSize) {
                memcpy(out + read, buf.data() + mBufferOffset, remaining);
                if (remaining == bufferSize) {
                    mBufferOffset = 0;
                    mBuffers.pop_front();
                } else {
                    mBufferOffset = remaining + mBufferOffset;
                }
                read += remaining;
                break;
            }
            memcpy(out + read, buf.data() + mBufferOffset, bufferSize);
            read += bufferSize;
            mBufferOffset = 0;
            remaining -= bufferSize;
            assert(!mBuffers.isEmpty());
            mBuffers.pop_front();
        }
        return read;
    }